

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

void bench_verify(void *arg,int iters)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  undefined1 *puVar6;
  long *plVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  undefined8 uStack_1a8;
  long lStack_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  long lStack_180;
  long lStack_178;
  long lStack_170;
  long lStack_168;
  undefined1 auStack_148 [64];
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  void *pvStack_f0;
  undefined1 *puStack_e8;
  code *pcStack_e0;
  uint local_cc;
  long local_c8;
  long local_c0;
  long local_b8;
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  
  if (0 < iters) {
    local_c0 = (long)arg + 0x48;
    local_b8 = (long)arg + 0x98;
    local_c8 = (long)arg + 8;
    uVar10 = 0;
    local_cc = iters;
    do {
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x47);
      *pbVar1 = *pbVar1 ^ (byte)uVar10;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x46);
      bVar9 = (byte)(uVar10 >> 8);
      *pbVar1 = *pbVar1 ^ bVar9;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x45);
      bVar4 = (byte)(uVar10 >> 0x10);
      *pbVar1 = *pbVar1 ^ bVar4;
      plVar7 = *arg;
      pcStack_e0 = (code *)0x1036a3;
      puVar6 = local_70;
      iVar2 = secp256k1_ec_pubkey_parse(plVar7,local_70,local_b8,*(undefined8 *)((long)arg + 0xc0));
      iVar5 = (int)puVar6;
      if (iVar2 != 1) {
        pcStack_e0 = (code *)0x10372c;
        bench_verify_cold_1();
LAB_0010372c:
        pcStack_e0 = (code *)0x103731;
        bench_verify_cold_2();
LAB_00103731:
        pcStack_e0 = bench_sign_run;
        bench_verify_cold_3();
        if (iVar5 < 1) {
          return;
        }
        uStack_108 = uVar10 >> 0x10;
        uStack_100 = uVar10 >> 8;
        uStack_f8 = uVar10;
        pvStack_f0 = arg;
        puStack_e8 = local_b0;
        pcStack_e0 = (code *)local_70;
        goto LAB_00103762;
      }
      plVar7 = *arg;
      pcStack_e0 = (code *)0x1036bf;
      puVar6 = local_b0;
      iVar2 = secp256k1_ecdsa_signature_parse_der
                        (plVar7,local_b0,local_c0,*(undefined8 *)((long)arg + 0x90));
      iVar5 = (int)puVar6;
      if (iVar2 != 1) goto LAB_0010372c;
      plVar7 = *arg;
      pcStack_e0 = (code *)0x1036d7;
      puVar6 = local_b0;
      uVar3 = secp256k1_ecdsa_verify(plVar7,local_b0,local_c8,local_70);
      iVar5 = (int)puVar6;
      if (uVar3 != ((int)uVar10 == 0)) goto LAB_00103731;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x47);
      *pbVar1 = *pbVar1 ^ (byte)uVar10;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x46);
      *pbVar1 = *pbVar1 ^ bVar9;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x45);
      *pbVar1 = *pbVar1 ^ bVar4;
      uVar3 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar3;
    } while (local_cc != uVar3);
  }
  return;
LAB_00103762:
  uStack_1a8 = 0x4a;
  lVar8 = *plVar7;
  iVar2 = secp256k1_ecdsa_sign(lVar8,auStack_148,plVar7 + 1,plVar7 + 5,0,0);
  if (iVar2 == 0) {
    bench_sign_run_cold_2();
LAB_001037e0:
    bench_sign_run_cold_1();
    *(undefined8 *)(lVar8 + 8) = 0x807060504030201;
    *(undefined8 *)(lVar8 + 0x10) = 0x100f0e0d0c0b0a09;
    *(undefined8 *)(lVar8 + 0x18) = 0x1817161514131211;
    *(undefined8 *)(lVar8 + 0x20) = 0x201f1e1d1c1b1a19;
    *(undefined8 *)(lVar8 + 0x28) = 0x4847464544434241;
    *(undefined8 *)(lVar8 + 0x30) = 0x504f4e4d4c4b4a49;
    *(undefined8 *)(lVar8 + 0x38) = 0x5857565554535251;
    *(undefined8 *)(lVar8 + 0x40) = 0x605f5e5d5c5b5a59;
    return;
  }
  lVar8 = *plVar7;
  iVar2 = secp256k1_ecdsa_signature_serialize_der(lVar8,&lStack_1a0,&uStack_1a8,auStack_148);
  if (iVar2 == 0) goto LAB_001037e0;
  plVar7[3] = lStack_190;
  plVar7[4] = lStack_188;
  plVar7[1] = lStack_1a0;
  plVar7[2] = lStack_198;
  plVar7[7] = lStack_170;
  plVar7[8] = lStack_168;
  plVar7[5] = lStack_180;
  plVar7[6] = lStack_178;
  iVar5 = iVar5 + -1;
  if (iVar5 == 0) {
    return;
  }
  goto LAB_00103762;
}

Assistant:

static void bench_verify(void* arg, int iters) {
    int i;
    bench_data* data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_pubkey pubkey;
        secp256k1_ecdsa_signature sig;
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
        CHECK(secp256k1_ec_pubkey_parse(data->ctx, &pubkey, data->pubkey, data->pubkeylen) == 1);
        CHECK(secp256k1_ecdsa_signature_parse_der(data->ctx, &sig, data->sig, data->siglen) == 1);
        CHECK(secp256k1_ecdsa_verify(data->ctx, &sig, data->msg, &pubkey) == (i == 0));
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
    }
}